

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  ulong *puVar1;
  char *pcVar2;
  ushort uVar3;
  short sVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  short *psVar8;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  int *piVar12;
  long *plVar13;
  char cVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong *puVar18;
  ulong uVar19;
  long *plVar20;
  int *piVar21;
  long *plVar22;
  char *pcVar23;
  ulong *puVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  char *pcVar28;
  int iVar29;
  ulong uVar30;
  BYTE *e;
  short *psVar31;
  short *local_4088;
  int local_4080;
  LZ4_stream_t ctxBody;
  
  iVar17 = 0;
  memset(&ctxBody,0,0x4020);
  ctxBody.internal_donotuse.currentOffset = *srcSizePtr;
  uVar10 = (ulong)(int)ctxBody.internal_donotuse.currentOffset;
  if (uVar10 < 0x7e000001) {
    iVar17 = ctxBody.internal_donotuse.currentOffset +
             ctxBody.internal_donotuse.currentOffset / 0xff + 0x10;
  }
  if (iVar17 <= targetDstSize) {
    iVar17 = LZ4_compress_fast_extState
                       (&ctxBody,src,dst,ctxBody.internal_donotuse.currentOffset,targetDstSize,1);
    return iVar17;
  }
  pcVar23 = dst + targetDstSize;
  iVar17 = (int)src;
  local_4088 = (short *)dst;
  ctxBody.internal_donotuse.dictSize = ctxBody.internal_donotuse.currentOffset;
  if ((int)ctxBody.internal_donotuse.currentOffset < 0x1000b) {
    if (0 < targetDstSize && ctxBody.internal_donotuse.currentOffset < 0x7e000001) {
      ctxBody.internal_donotuse.tableType = 3;
      piVar21 = (int *)src;
      if (0xc < ctxBody.internal_donotuse.currentOffset) {
        *(undefined2 *)((long)&ctxBody + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0
        ;
LAB_0010ca02:
        uVar9 = 1;
        uVar30 = 0x40;
        iVar15 = *(int *)((long)piVar21 + 1);
        piVar12 = (int *)((long)piVar21 + 1);
        do {
          piVar11 = piVar12;
          piVar12 = (int *)(uVar9 + (long)piVar11);
          if (src + (uVar10 - 0xb) < piVar12) goto LAB_0010d210;
          uVar9 = uVar30 >> 6;
          uVar30 = (ulong)((int)uVar30 + 1);
          uVar26 = (ulong)((uint)(iVar15 * -0x61c8864f) >> 0x13);
          uVar19 = (ulong)*(ushort *)((long)&ctxBody + uVar26 * 2);
          sVar4 = (short)src;
          iVar15 = *piVar12;
          *(short *)((long)&ctxBody + uVar26 * 2) = (short)piVar11 - sVar4;
        } while (*(int *)(src + uVar19) != *piVar11);
        lVar16 = 0;
        cVar5 = (char)piVar11 * '\x10' + (char)piVar21 * -0x10;
        do {
          cVar14 = cVar5;
          lVar27 = lVar16;
          pcVar28 = src + lVar27 + uVar19;
          piVar12 = (int *)((long)piVar11 + lVar27);
          if ((pcVar28 <= src) || (piVar12 <= piVar21)) break;
          lVar16 = lVar27 + -1;
          cVar5 = cVar14 + -0x10;
        } while (*(char *)((long)piVar11 + lVar27 + -1) == src[lVar27 + (uVar19 - 1)]);
        iVar25 = (int)piVar11 - (int)piVar21;
        iVar15 = (int)lVar27;
        uVar9 = (ulong)(uint)(iVar25 + iVar15);
        uVar7 = iVar25 + iVar15;
        if ((char *)((long)local_4088 + uVar9 + (ulong)(uVar7 + 0xf0) / 0xff + 0xc) <= pcVar23) {
          if (uVar7 < 0xf) {
            psVar8 = (short *)((long)local_4088 + 1);
            *(char *)local_4088 = cVar14;
          }
          else {
            *(char *)local_4088 = -0x10;
            psVar8 = local_4088 + 1;
            for (iVar15 = ((int)piVar11 - (int)piVar21) + iVar15 + -0xf; 0xfe < iVar15;
                iVar15 = iVar15 + -0xff) {
              *(char *)((long)psVar8 + -1) = -1;
              psVar8 = (short *)((long)psVar8 + 1);
            }
            *(char *)((long)psVar8 + -1) = (char)iVar15;
          }
          psVar31 = (short *)(uVar9 + (long)psVar8);
          lVar16 = 0;
          do {
            pcVar2 = (char *)((long)psVar8 + lVar16);
            *(undefined8 *)pcVar2 = *(undefined8 *)((long)piVar21 + lVar16);
            lVar16 = lVar16 + 8;
          } while (pcVar2 + 8 < psVar31);
          do {
            if (pcVar23 < (char *)((long)psVar31 + 0xb)) break;
            *psVar31 = (short)piVar12 - (short)pcVar28;
            puVar1 = (ulong *)(piVar12 + 1);
            puVar18 = (ulong *)(pcVar28 + 4);
            puVar24 = puVar1;
            if (src + (uVar10 - 0xc) <= puVar1) {
LAB_0010cb6d:
              iVar15 = ((int)puVar24 - (int)piVar12) + -4;
LAB_0010cb75:
              if (puVar24 < src + (uVar10 - 0xc)) {
                if (*puVar18 == *puVar24) goto code_r0x0010cb89;
                uVar30 = *puVar24 ^ *puVar18;
                uVar9 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                  }
                }
                uVar9 = (ulong)(((uint)(uVar9 >> 3) & 0x1fffffff) + iVar15);
              }
              else {
                if ((puVar24 < src + (uVar10 - 8)) && ((int)*puVar18 == (int)*puVar24)) {
                  puVar24 = (ulong *)((long)puVar24 + 4);
                  puVar18 = (ulong *)((long)puVar18 + 4);
                }
                if ((puVar24 < src + (uVar10 - 6)) && ((short)*puVar18 == (short)*puVar24)) {
                  puVar24 = (ulong *)((long)puVar24 + 2);
                  puVar18 = (ulong *)((long)puVar18 + 2);
                }
                if (puVar24 < src + (uVar10 - 5)) {
                  puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar18 == (char)*puVar24));
                }
                uVar9 = (ulong)(uint)((int)puVar24 - (int)puVar1);
              }
              goto LAB_0010cbb1;
            }
            if (*puVar18 == *puVar1) {
              puVar18 = (ulong *)(pcVar28 + 0xc);
              puVar24 = (ulong *)(piVar12 + 3);
              goto LAB_0010cb6d;
            }
            uVar30 = *puVar1 ^ *puVar18;
            uVar9 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar9 = uVar9 >> 3 & 0x1fffffff;
LAB_0010cbb1:
            psVar8 = psVar31 + 1;
            uVar6 = (uint)uVar9;
            piVar12 = (int *)((long)piVar12 + uVar9 + 4);
            uVar7 = uVar6;
            if (pcVar23 < (char *)((long)psVar31 + (ulong)(uVar6 + 0xf0) / 0xff + 8)) {
              uVar7 = ((int)pcVar23 - (int)psVar8) * 0xff - 0x5ec;
              piVar12 = (int *)((long)piVar12 - (ulong)(uVar6 - uVar7));
              piVar21 = piVar12;
              if (piVar12 <= piVar11) {
                for (; piVar21 <= piVar11; piVar21 = (int *)((long)piVar21 + 1)) {
                  *(undefined2 *)
                   ((long)&ctxBody + (ulong)((uint)(*piVar21 * -0x61c8864f) >> 0x13) * 2) = 0;
                }
              }
            }
            if (uVar7 < 0xf) {
              *(char *)local_4088 = (char)*local_4088 + (char)uVar7;
              local_4088 = psVar8;
            }
            else {
              *(char *)local_4088 = (char)*local_4088 + '\x0f';
              psVar8[0] = -1;
              psVar8[1] = -1;
              lVar16 = 0;
              for (uVar6 = uVar7 - 0xf; 0x3fb < uVar6; uVar6 = uVar6 - 0x3fc) {
                pcVar28 = (char *)((long)psVar31 + lVar16 + 6);
                pcVar28[0] = -1;
                pcVar28[1] = -1;
                pcVar28[2] = -1;
                pcVar28[3] = -1;
                lVar16 = lVar16 + 4;
              }
              lVar27 = lVar16 + (ulong)(uVar6 & 0xffff) / 0xff;
              *(char *)((long)psVar31 + lVar27 + 2) =
                   (char)((ushort)uVar6 / 0xff) + (char)uVar7 + -0xf + (char)lVar16;
              local_4088 = (short *)((long)psVar31 + lVar27 + 3);
            }
            piVar21 = piVar12;
            if (src + (uVar10 - 0xb) <= piVar12) break;
            *(short *)((long)&ctxBody +
                      (ulong)((uint)(*(int *)((long)piVar12 + -2) * -0x61c8864f) >> 0x13) * 2) =
                 ((short)piVar12 + -2) - sVar4;
            uVar9 = (ulong)((uint)(*piVar12 * -0x61c8864f) >> 0x13);
            uVar3 = *(ushort *)((long)&ctxBody + uVar9 * 2);
            pcVar28 = src + uVar3;
            *(short *)((long)&ctxBody + uVar9 * 2) = (short)piVar12 - sVar4;
            if (*(int *)(src + uVar3) != *piVar12) goto LAB_0010ca02;
            psVar31 = (short *)((long)local_4088 + 1);
            *(char *)local_4088 = '\0';
          } while( true );
        }
      }
LAB_0010d210:
      pcVar28 = src + (uVar10 - (long)piVar21);
      if (pcVar23 < (char *)((long)local_4088 + (long)(pcVar28 + (ulong)(pcVar28 + 0xf0) / 0xff + 1)
                            )) {
        pcVar28 = pcVar23 + (~(ulong)local_4088 -
                            (ulong)(pcVar23 + ~(ulong)local_4088 + 0xf0) / 0xff);
      }
      if (pcVar28 < (char *)0xf) {
        *(char *)local_4088 = (char)pcVar28 << 4;
      }
      else {
        *(char *)local_4088 = -0x10;
        for (pcVar23 = pcVar28 + -0xf; local_4088 = (short *)((long)local_4088 + 1),
            (char *)0xfe < pcVar23; pcVar23 = pcVar23 + -0xff) {
          *(char *)local_4088 = -1;
        }
        *(char *)local_4088 = (char)pcVar23;
      }
      memcpy((char *)((long)local_4088 + 1),piVar21,(size_t)pcVar28);
      iVar25 = (int)piVar21 + (int)pcVar28;
      iVar15 = (int)(char *)((long)local_4088 + 1) + (int)pcVar28;
LAB_0010d2a2:
      *srcSizePtr = iVar25 - iVar17;
      local_4080 = (int)dst;
      return iVar15 - local_4080;
    }
  }
  else if (0 < targetDstSize && ctxBody.internal_donotuse.currentOffset < 0x7e000001) {
    ctxBody.internal_donotuse.tableType = 2;
    *(undefined4 *)((long)&ctxBody + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = 0;
    plVar13 = (long *)src;
LAB_0010ce03:
    uVar9 = 1;
    uVar30 = 0x40;
    lVar16 = *(long *)((long)plVar13 + 1);
    plVar22 = (long *)((long)plVar13 + 1);
    while( true ) {
      plVar20 = (long *)(uVar9 + (long)plVar22);
      if (src + (uVar10 - 0xb) < plVar20) goto LAB_0010d16b;
      uVar19 = (ulong)(lVar16 * -0x30e4432345000000) >> 0x34;
      uVar7 = *(uint *)((long)&ctxBody + uVar19 * 4);
      uVar9 = (ulong)uVar7;
      iVar15 = (int)plVar22;
      lVar16 = *plVar20;
      *(int *)((long)&ctxBody + uVar19 * 4) = iVar15 - iVar17;
      if (((uint)(iVar15 - iVar17) <= uVar7 + 0xffff) && (*(int *)(src + uVar9) == (int)*plVar22))
      break;
      uVar9 = uVar30 >> 6;
      uVar30 = (ulong)((int)uVar30 + 1);
      plVar22 = plVar20;
    }
    lVar16 = 0;
    cVar5 = (char)plVar22 * '\x10' + (char)plVar13 * -0x10;
    do {
      cVar14 = cVar5;
      lVar27 = lVar16;
      piVar21 = (int *)(src + lVar27 + uVar9);
      plVar20 = (long *)((long)plVar22 + lVar27);
      if ((piVar21 <= src) || (plVar20 <= plVar13)) break;
      lVar16 = lVar27 + -1;
      cVar5 = cVar14 + -0x10;
    } while (*(char *)((long)plVar22 + lVar27 + -1) == src[lVar27 + (uVar9 - 1)]);
    iVar29 = iVar15 - (int)plVar13;
    iVar25 = (int)lVar27;
    uVar9 = (ulong)(uint)(iVar25 + iVar29);
    uVar7 = iVar29 + iVar25;
    if ((char *)((long)local_4088 + uVar9 + (ulong)(uVar7 + 0xf0) / 0xff + 0xc) <= pcVar23) {
      if (uVar7 < 0xf) {
        psVar8 = (short *)((long)local_4088 + 1);
        *(char *)local_4088 = cVar14;
      }
      else {
        *(char *)local_4088 = -0x10;
        psVar8 = local_4088 + 1;
        for (iVar15 = (iVar15 - (int)plVar13) + iVar25 + -0xf; 0xfe < iVar15;
            iVar15 = iVar15 + -0xff) {
          *(char *)((long)psVar8 + -1) = -1;
          psVar8 = (short *)((long)psVar8 + 1);
        }
        *(char *)((long)psVar8 + -1) = (char)iVar15;
      }
      psVar31 = (short *)(uVar9 + (long)psVar8);
      lVar16 = 0;
      do {
        pcVar28 = (char *)((long)psVar8 + lVar16);
        *(undefined8 *)pcVar28 = *(undefined8 *)((long)plVar13 + lVar16);
        lVar16 = lVar16 + 8;
      } while (pcVar28 + 8 < psVar31);
      do {
        if (pcVar23 < (char *)((long)psVar31 + 0xb)) break;
        *psVar31 = (short)plVar20 - (short)piVar21;
        puVar1 = (ulong *)((long)plVar20 + 4);
        puVar18 = (ulong *)(piVar21 + 1);
        puVar24 = puVar1;
        if (src + (uVar10 - 0xc) <= puVar1) {
LAB_0010cf7b:
          iVar15 = ((int)puVar24 - (int)plVar20) + -4;
LAB_0010cf82:
          if (puVar24 < src + (uVar10 - 0xc)) {
            if (*puVar18 == *puVar24) goto code_r0x0010cf96;
            uVar30 = *puVar24 ^ *puVar18;
            uVar9 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar9 = (ulong)(((uint)(uVar9 >> 3) & 0x1fffffff) + iVar15);
          }
          else {
            if ((puVar24 < src + (uVar10 - 8)) && ((int)*puVar18 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar18 = (ulong *)((long)puVar18 + 4);
            }
            if ((puVar24 < src + (uVar10 - 6)) && ((short)*puVar18 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar18 = (ulong *)((long)puVar18 + 2);
            }
            if (puVar24 < src + (uVar10 - 5)) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar18 == (char)*puVar24));
            }
            uVar9 = (ulong)(uint)((int)puVar24 - (int)puVar1);
          }
          goto LAB_0010cfbb;
        }
        if (*puVar18 == *puVar1) {
          puVar18 = (ulong *)(piVar21 + 3);
          puVar24 = (ulong *)((long)plVar20 + 0xc);
          goto LAB_0010cf7b;
        }
        uVar30 = *puVar1 ^ *puVar18;
        uVar9 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar9 = uVar9 >> 3 & 0x1fffffff;
LAB_0010cfbb:
        psVar8 = psVar31 + 1;
        uVar6 = (uint)uVar9;
        plVar20 = (long *)((long)plVar20 + uVar9 + 4);
        uVar7 = uVar6;
        if (pcVar23 < (char *)((long)psVar31 + (ulong)(uVar6 + 0xf0) / 0xff + 8)) {
          uVar7 = ((int)pcVar23 - (int)psVar8) * 0xff - 0x5ec;
          plVar20 = (long *)((long)plVar20 - (ulong)(uVar6 - uVar7));
          plVar13 = plVar20;
          if (plVar20 <= plVar22) {
            for (; plVar13 <= plVar22; plVar13 = (long *)((long)plVar13 + 1)) {
              *(undefined4 *)
               ((long)&ctxBody + ((ulong)(*plVar13 * -0x30e4432345000000) >> 0x34) * 4) = 0;
            }
          }
        }
        if (uVar7 < 0xf) {
          *(char *)local_4088 = (char)*local_4088 + (char)uVar7;
          local_4088 = psVar8;
        }
        else {
          *(char *)local_4088 = (char)*local_4088 + '\x0f';
          psVar8[0] = -1;
          psVar8[1] = -1;
          lVar16 = 0;
          for (uVar6 = uVar7 - 0xf; 0x3fb < uVar6; uVar6 = uVar6 - 0x3fc) {
            pcVar28 = (char *)((long)psVar31 + lVar16 + 6);
            pcVar28[0] = -1;
            pcVar28[1] = -1;
            pcVar28[2] = -1;
            pcVar28[3] = -1;
            lVar16 = lVar16 + 4;
          }
          lVar27 = lVar16 + (ulong)(uVar6 & 0xffff) / 0xff;
          *(char *)((long)psVar31 + lVar27 + 2) =
               (char)((ushort)uVar6 / 0xff) + (char)uVar7 + -0xf + (char)lVar16;
          local_4088 = (short *)((long)psVar31 + lVar27 + 3);
        }
        plVar13 = plVar20;
        if (src + (uVar10 - 0xb) <= plVar20) break;
        *(int *)((long)&ctxBody +
                ((ulong)(*(long *)((long)plVar20 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)plVar20 + -2) - iVar17;
        uVar9 = (ulong)(*plVar20 * -0x30e4432345000000) >> 0x34;
        uVar6 = (int)plVar20 - iVar17;
        uVar7 = *(uint *)((long)&ctxBody + uVar9 * 4);
        piVar21 = (int *)(src + uVar7);
        *(uint *)((long)&ctxBody + uVar9 * 4) = uVar6;
        if ((uVar7 + 0xffff < uVar6) || (*piVar21 != (int)*plVar20)) goto LAB_0010ce03;
        psVar31 = (short *)((long)local_4088 + 1);
        *(char *)local_4088 = '\0';
      } while( true );
    }
LAB_0010d16b:
    pcVar28 = src + (uVar10 - (long)plVar13);
    if (pcVar23 < (char *)((long)local_4088 + (long)(pcVar28 + (ulong)(pcVar28 + 0xf0) / 0xff + 1)))
    {
      pcVar28 = pcVar23 + (~(ulong)local_4088 - (ulong)(pcVar23 + ~(ulong)local_4088 + 0xf0) / 0xff)
      ;
    }
    if (pcVar28 < (char *)0xf) {
      *(char *)local_4088 = (char)pcVar28 << 4;
    }
    else {
      *(char *)local_4088 = -0x10;
      for (pcVar23 = pcVar28 + -0xf; local_4088 = (short *)((long)local_4088 + 1),
          (char *)0xfe < pcVar23; pcVar23 = pcVar23 + -0xff) {
        *(char *)local_4088 = -1;
      }
      *(char *)local_4088 = (char)pcVar23;
    }
    memcpy((char *)((long)local_4088 + 1),plVar13,(size_t)pcVar28);
    iVar25 = (int)plVar13 + (int)pcVar28;
    iVar15 = (int)(char *)((long)local_4088 + 1) + (int)pcVar28;
    goto LAB_0010d2a2;
  }
  return 0;
code_r0x0010cf96:
  puVar24 = puVar24 + 1;
  puVar18 = puVar18 + 1;
  iVar15 = iVar15 + 8;
  goto LAB_0010cf82;
code_r0x0010cb89:
  puVar24 = puVar24 + 1;
  puVar18 = puVar18 + 1;
  iVar15 = iVar15 + 8;
  goto LAB_0010cb75;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}